

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::js::Generator::GenerateFileAndDeps
          (Generator *this,GeneratorOptions *options,Printer *printer,FileDescriptor *root,
          set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *all_files,
          set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *generated)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  pair<std::_Rb_tree_const_iterator<const_google::protobuf::FileDescriptor_*>,_bool> pVar4;
  _Self local_78;
  _Self local_70;
  FileDescriptor *local_68;
  FileDescriptor *dep;
  _Rb_tree_const_iterator<const_google::protobuf::FileDescriptor_*> _Stack_58;
  int i;
  undefined1 local_50;
  _Self local_48;
  _Self local_40;
  set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *local_38;
  set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *generated_local;
  set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *all_files_local;
  FileDescriptor *root_local;
  Printer *printer_local;
  GeneratorOptions *options_local;
  Generator *this_local;
  
  local_38 = generated;
  generated_local = all_files;
  all_files_local =
       (set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
        *)root;
  root_local = (FileDescriptor *)printer;
  printer_local = (Printer *)options;
  options_local = (GeneratorOptions *)this;
  local_40._M_node =
       (_Base_ptr)
       std::
       set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
       ::find(generated,(key_type *)&all_files_local);
  local_48._M_node =
       (_Base_ptr)
       std::
       set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
       ::end(local_38);
  bVar2 = std::operator!=(&local_40,&local_48);
  if (!bVar2) {
    pVar4 = std::
            set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            ::insert(local_38,(value_type *)&all_files_local);
    _Stack_58 = pVar4.first._M_node;
    local_50 = pVar4.second;
    for (dep._4_4_ = 0; iVar1 = dep._4_4_,
        iVar3 = FileDescriptor::dependency_count((FileDescriptor *)all_files_local), iVar1 < iVar3;
        dep._4_4_ = dep._4_4_ + 1) {
      local_68 = FileDescriptor::dependency((FileDescriptor *)all_files_local,dep._4_4_);
      GenerateFileAndDeps(this,(GeneratorOptions *)printer_local,(Printer *)root_local,local_68,
                          generated_local,local_38);
    }
    local_70._M_node =
         (_Base_ptr)
         std::
         set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
         ::find(generated_local,(key_type *)&all_files_local);
    local_78._M_node =
         (_Base_ptr)
         std::
         set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
         ::end(generated_local);
    bVar2 = std::operator!=(&local_70,&local_78);
    if (bVar2) {
      GenerateClassesAndEnums
                (this,(GeneratorOptions *)printer_local,(Printer *)root_local,
                 (FileDescriptor *)all_files_local);
    }
  }
  return;
}

Assistant:

void Generator::GenerateFileAndDeps(
    const GeneratorOptions& options, io::Printer* printer,
    const FileDescriptor* root, std::set<const FileDescriptor*>* all_files,
    std::set<const FileDescriptor*>* generated) const {
  // Skip if already generated.
  if (generated->find(root) != generated->end()) {
    return;
  }
  generated->insert(root);

  // Generate all dependencies before this file's content.
  for (int i = 0; i < root->dependency_count(); i++) {
    const FileDescriptor* dep = root->dependency(i);
    GenerateFileAndDeps(options, printer, dep, all_files, generated);
  }

  // Generate this file's content.  Only generate if the file is part of the
  // original set requested to be generated; i.e., don't take all transitive
  // deps down to the roots.
  if (all_files->find(root) != all_files->end()) {
    GenerateClassesAndEnums(options, printer, root);
  }
}